

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::idct(jpgd_block_coeff_t *pSrc_ptr,uint8 *pDst_ptr,int block_max_zag,bool use_simd)

{
  undefined1 uVar1;
  uint local_14c;
  int local_144;
  int nonzero_rows;
  int i;
  uint8 *pRow_tab;
  int *pTemp;
  jpgd_block_coeff_t *pSrc;
  int temp [64];
  int i_1;
  int k;
  bool use_simd_local;
  uint *puStack_18;
  int block_max_zag_local;
  uint8 *pDst_ptr_local;
  jpgd_block_coeff_t *pSrc_ptr_local;
  
  if (block_max_zag < 1) {
    __assert_fail("block_max_zag >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x11f,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
  }
  if (0x40 < block_max_zag) {
    __assert_fail("block_max_zag <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x120,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
  }
  puStack_18 = (uint *)pDst_ptr;
  if (block_max_zag < 2) {
    local_14c = (*pSrc_ptr + 4 >> 3) + 0x80;
    if (0xff < local_14c) {
      local_14c = (int)(local_14c ^ 0xffffffff) >> 0x1f & 0xff;
    }
    local_14c = local_14c | local_14c << 8;
    local_14c = local_14c | local_14c << 0x10;
    for (temp[0x3e] = 8; 0 < temp[0x3e]; temp[0x3e] = temp[0x3e] + -1) {
      *puStack_18 = local_14c;
      puStack_18[1] = local_14c;
      puStack_18 = puStack_18 + 2;
    }
  }
  else if (use_simd) {
    if (((ulong)pSrc_ptr & 0xf) != 0) {
      __assert_fail("(((uintptr_t)pSrc_ptr) & 15) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x135,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
    }
    if (((ulong)pDst_ptr & 0xf) != 0) {
      __assert_fail("(((uintptr_t)pDst_ptr) & 15) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x136,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
    }
    idctSSEShortU8(pSrc_ptr,pDst_ptr);
  }
  else {
    pRow_tab = (uint8 *)&pSrc;
    _nonzero_rows = s_idct_row_table + (block_max_zag + -1) * 8;
    pTemp = (int *)pSrc_ptr;
    for (local_144 = 8; 0 < local_144; local_144 = local_144 + -1) {
      switch(*_nonzero_rows) {
      case 0:
        Row<0>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 1:
        Row<1>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 2:
        Row<2>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 3:
        Row<3>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 4:
        Row<4>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 5:
        Row<5>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 6:
        Row<6>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 7:
        Row<7>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
        break;
      case 8:
        Row<8>::idct((int *)pRow_tab,(jpgd_block_coeff_t *)pTemp);
      }
      pTemp = pTemp + 4;
      pRow_tab = pRow_tab + 0x20;
      _nonzero_rows = _nonzero_rows + 1;
    }
    pRow_tab = (uint8 *)&pSrc;
    uVar1 = s_idct_col_table[block_max_zag + -1];
    for (local_144 = 8; 0 < local_144; local_144 = local_144 + -1) {
      switch(uVar1) {
      case 1:
        Col<1>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 2:
        Col<2>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 3:
        Col<3>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 4:
        Col<4>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 5:
        Col<5>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 6:
        Col<6>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 7:
        Col<7>::idct((uint8 *)puStack_18,(int *)pRow_tab);
        break;
      case 8:
        Col<8>::idct((uint8 *)puStack_18,(int *)pRow_tab);
      }
      pRow_tab = pRow_tab + 4;
      puStack_18 = (uint *)((long)puStack_18 + 1);
    }
  }
  return;
}

Assistant:

static void idct(const jpgd_block_coeff_t* pSrc_ptr, uint8* pDst_ptr, int block_max_zag, bool use_simd)
	{
		(void)use_simd;

		assert(block_max_zag >= 1);
		assert(block_max_zag <= 64);
				
		if (block_max_zag <= 1)
		{
			int k = ((pSrc_ptr[0] + 4) >> 3) + 128;
			k = CLAMP(k);
			k = k | (k << 8);
			k = k | (k << 16);

			for (int i = 8; i > 0; i--)
			{
				*(int*)&pDst_ptr[0] = k;
				*(int*)&pDst_ptr[4] = k;
				pDst_ptr += 8;
			}
			return;
		}

#if JPGD_USE_SSE2
		if (use_simd)
		{
			assert((((uintptr_t)pSrc_ptr) & 15) == 0);
			assert((((uintptr_t)pDst_ptr) & 15) == 0);
			idctSSEShortU8(pSrc_ptr, pDst_ptr);
			return;
		}
#endif

		int temp[64];

		const jpgd_block_coeff_t* pSrc = pSrc_ptr;
		int* pTemp = temp;

		const uint8* pRow_tab = &s_idct_row_table[(block_max_zag - 1) * 8];
		int i;
		for (i = 8; i > 0; i--, pRow_tab++)
		{
			switch (*pRow_tab)
			{
			case 0: Row<0>::idct(pTemp, pSrc); break;
			case 1: Row<1>::idct(pTemp, pSrc); break;
			case 2: Row<2>::idct(pTemp, pSrc); break;
			case 3: Row<3>::idct(pTemp, pSrc); break;
			case 4: Row<4>::idct(pTemp, pSrc); break;
			case 5: Row<5>::idct(pTemp, pSrc); break;
			case 6: Row<6>::idct(pTemp, pSrc); break;
			case 7: Row<7>::idct(pTemp, pSrc); break;
			case 8: Row<8>::idct(pTemp, pSrc); break;
			}

			pSrc += 8;
			pTemp += 8;
		}

		pTemp = temp;

		const int nonzero_rows = s_idct_col_table[block_max_zag - 1];
		for (i = 8; i > 0; i--)
		{
			switch (nonzero_rows)
			{
			case 1: Col<1>::idct(pDst_ptr, pTemp); break;
			case 2: Col<2>::idct(pDst_ptr, pTemp); break;
			case 3: Col<3>::idct(pDst_ptr, pTemp); break;
			case 4: Col<4>::idct(pDst_ptr, pTemp); break;
			case 5: Col<5>::idct(pDst_ptr, pTemp); break;
			case 6: Col<6>::idct(pDst_ptr, pTemp); break;
			case 7: Col<7>::idct(pDst_ptr, pTemp); break;
			case 8: Col<8>::idct(pDst_ptr, pTemp); break;
			}

			pTemp++;
			pDst_ptr++;
		}
	}